

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  RationalNum **ppRVar1;
  bool bVar2;
  ParsedInput *pPVar3;
  Polynomial *polynomial;
  _Base_ptr p_Var4;
  _Rb_tree<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::_Identity<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
  *this;
  _Base_ptr p_Var5;
  ostream *poVar6;
  void *pvVar7;
  RationalNum **matrix;
  void *pvVar8;
  RationalNum *pRVar9;
  RationalNum **ppRVar10;
  int j_1;
  ulong uVar11;
  int j;
  int iVar12;
  ulong uVar13;
  char *pcVar14;
  int i;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  int i_1;
  RationalNum eigenValue_1;
  set<RationalNum,_std::less<RationalNum>,_std::allocator<RationalNum>_> eigenValues;
  map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
  eigenSpaces;
  set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
  basis;
  string local_50;
  
  if (argc < 2) {
    pcVar14 = "You must write filename";
  }
  else {
    std::__cxx11::string::string((string *)&local_50,argv[1],(allocator *)&eigenValues);
    pPVar3 = parseInput(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (pPVar3 != (ParsedInput *)0x0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Matrix:");
      std::endl<char,std::char_traits<char>>(poVar6);
      uVar17 = 0;
      while( true ) {
        uVar11 = (ulong)pPVar3->n;
        if (uVar11 <= uVar17) break;
        lVar18 = 0;
        for (uVar13 = 0; uVar13 < uVar11; uVar13 = uVar13 + 1) {
          *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18))
               = 3;
          poVar6 = operator<<((ostream *)&std::cout,
                              (RationalNum *)((long)&pPVar3->matrix[uVar17]->numerator + lVar18));
          std::operator<<(poVar6," ");
          uVar11 = (ulong)pPVar3->n;
          lVar18 = lVar18 + 0x10;
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        uVar17 = uVar17 + 1;
      }
      polynomial = getCharacteristicPolynomial(pPVar3->matrix,pPVar3->n);
      poVar6 = std::operator<<((ostream *)&std::cout,"Characteristics polynomial:");
      std::endl<char,std::char_traits<char>>(poVar6);
      std::operator<<((ostream *)&std::cout,"F(x) = ");
      uVar16 = polynomial->degree;
LAB_001047d3:
      while( true ) {
        while( true ) {
          uVar15 = uVar16;
          if ((int)uVar15 < 0) {
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            poVar6 = std::operator<<((ostream *)&std::cout,"Rational eigenvalues: ");
            std::endl<char,std::char_traits<char>>(poVar6);
            findRationalSolutions(&eigenValues,polynomial);
            iVar12 = 1;
            p_Var4 = eigenValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            while ((_Rb_tree_header *)p_Var4 != &eigenValues._M_t._M_impl.super__Rb_tree_header) {
              eigenSpaces._M_t._M_impl._0_4_ = p_Var4[1]._M_color;
              eigenSpaces._M_t._M_impl._4_4_ = *(undefined4 *)&p_Var4[1].field_0x4;
              eigenSpaces._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = p_Var4[1]._M_parent;
              poVar6 = std::operator<<((ostream *)&std::cout,"x_");
              poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar12);
              poVar6 = std::operator<<(poVar6," = ");
              poVar6 = operator<<(poVar6,(RationalNum *)&eigenSpaces);
              std::endl<char,std::char_traits<char>>(poVar6);
              p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
              iVar12 = iVar12 + 1;
            }
            eigenSpaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &eigenSpaces._M_t._M_impl.super__Rb_tree_header._M_header;
            eigenSpaces._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 eigenSpaces._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000
            ;
            eigenSpaces._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            eigenSpaces._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            eigenSpaces._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 eigenSpaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            poVar6 = std::operator<<((ostream *)&std::cout,"Eigenspaces: ");
            std::endl<char,std::char_traits<char>>(poVar6);
            for (p_Var4 = eigenValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var4 != &eigenValues._M_t._M_impl.super__Rb_tree_header;
                p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
              eigenValue_1.numerator = *(longlong *)(p_Var4 + 1);
              eigenValue_1.denominator = (longlong)p_Var4[1]._M_parent;
              getEigenSpaceBasis(&basis,pPVar3->matrix,pPVar3->n,*(RationalNum *)(p_Var4 + 1));
              this = &std::
                      map<RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
                      ::operator[](&eigenSpaces,&eigenValue_1)->_M_t;
              std::
              _Rb_tree<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::_Identity<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
              ::operator=(this,&basis._M_t);
              poVar6 = std::operator<<((ostream *)&std::cout,"L(");
              poVar6 = operator<<(poVar6,&eigenValue_1);
              std::operator<<(poVar6,") = span ( ");
              for (p_Var5 = basis._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var5 != &basis._M_t._M_impl.super__Rb_tree_header;
                  p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
                std::operator<<((ostream *)&std::cout,"(");
                lVar18 = 0;
                for (uVar17 = 0;
                    uVar17 < (ulong)((long)p_Var5[1]._M_parent - *(long *)(p_Var5 + 1) >> 4);
                    uVar17 = uVar17 + 1) {
                  operator<<((ostream *)&std::cout,(RationalNum *)(*(long *)(p_Var5 + 1) + lVar18));
                  if (uVar17 < ((long)p_Var5[1]._M_parent - *(long *)(p_Var5 + 1) >> 4) - 1U) {
                    std::operator<<((ostream *)&std::cout,", ");
                  }
                  lVar18 = lVar18 + 0x10;
                }
                std::operator<<((ostream *)&std::cout,") ");
              }
              poVar6 = std::operator<<((ostream *)&std::cout,")");
              std::endl<char,std::char_traits<char>>(poVar6);
              std::
              _Rb_tree<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::_Identity<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
              ::~_Rb_tree(&basis._M_t);
            }
            uVar16 = 0;
            for (p_Var4 = eigenSpaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var4 != &eigenSpaces._M_t._M_impl.super__Rb_tree_header;
                p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
              uVar16 = uVar16 + *(int *)&p_Var4[2]._M_right;
            }
            if (uVar16 < pPVar3->n) {
              poVar6 = std::operator<<((ostream *)&std::cout,
                                       "Not enough eigen vectors to make eigen basis");
              std::endl<char,std::char_traits<char>>(poVar6);
            }
            else {
              uVar17 = (ulong)pPVar3->n << 3;
              pvVar7 = operator_new__(uVar17);
              matrix = (RationalNum **)operator_new__(uVar17);
              for (uVar17 = 0; uVar17 < pPVar3->n; uVar17 = uVar17 + 1) {
                uVar13 = (ulong)pPVar3->n << 4;
                pvVar8 = operator_new__(uVar13);
                uVar11 = 0;
                do {
                  RationalNum::RationalNum((RationalNum *)(uVar11 + (long)pvVar8));
                  uVar11 = uVar11 + 0x10;
                } while (uVar13 != uVar11);
                *(void **)((long)pvVar7 + uVar17 * 8) = pvVar8;
                uVar16 = pPVar3->n;
                uVar11 = (ulong)uVar16 << 4;
                pRVar9 = (RationalNum *)operator_new__(uVar11);
                if ((ulong)uVar16 != 0) {
                  uVar13 = 0;
                  do {
                    RationalNum::RationalNum((RationalNum *)((long)&pRVar9->numerator + uVar13));
                    uVar13 = uVar13 + 0x10;
                  } while (uVar11 != uVar13);
                }
                matrix[uVar17] = pRVar9;
              }
              lVar18 = 0;
              for (p_Var4 = eigenSpaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var4 != &eigenSpaces._M_t._M_impl.super__Rb_tree_header;
                  p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
                lVar18 = (long)(int)lVar18;
                for (p_Var5 = p_Var4[2]._M_parent; p_Var5 != (_Base_ptr)&p_Var4[1]._M_right;
                    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
                  std::vector<RationalNum,_std::allocator<RationalNum>_>::vector
                            ((vector<RationalNum,_std::allocator<RationalNum>_> *)&basis,
                             (vector<RationalNum,_std::allocator<RationalNum>_> *)(p_Var5 + 1));
                  RationalNum::operator=
                            ((RationalNum *)(*(long *)((long)pvVar7 + lVar18 * 8) + lVar18 * 0x10),
                             (RationalNum *)(p_Var4 + 1));
                  lVar19 = 0;
                  for (uVar17 = 0; uVar17 < pPVar3->n; uVar17 = uVar17 + 1) {
                    RationalNum::operator=
                              (matrix[uVar17] + lVar18,
                               (RationalNum *)(basis._M_t._M_impl._0_8_ + lVar19));
                    lVar19 = lVar19 + 0x10;
                  }
                  lVar18 = lVar18 + 1;
                  std::_Vector_base<RationalNum,_std::allocator<RationalNum>_>::~_Vector_base
                            ((_Vector_base<RationalNum,_std::allocator<RationalNum>_> *)&basis);
                }
              }
              ppRVar10 = getInverseMatrix(matrix,pPVar3->n);
              poVar6 = std::operator<<((ostream *)&std::cout,"Matrix decomposition: ");
              std::endl<char,std::char_traits<char>>(poVar6);
              poVar6 = std::operator<<((ostream *)&std::cout,"A = C D C^(-1)");
              std::endl<char,std::char_traits<char>>(poVar6);
              poVar6 = std::operator<<((ostream *)&std::cout,"C:");
              std::endl<char,std::char_traits<char>>(poVar6);
              for (uVar17 = 0; uVar11 = (ulong)pPVar3->n, uVar17 < uVar11; uVar17 = uVar17 + 1) {
                lVar18 = 0;
                for (uVar13 = 0; uVar13 < uVar11; uVar13 = uVar13 + 1) {
                  poVar6 = operator<<((ostream *)&std::cout,
                                      (RationalNum *)((long)&matrix[uVar17]->numerator + lVar18));
                  std::operator<<(poVar6," ");
                  uVar11 = (ulong)pPVar3->n;
                  lVar18 = lVar18 + 0x10;
                }
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              }
              poVar6 = std::operator<<((ostream *)&std::cout,"D:");
              std::endl<char,std::char_traits<char>>(poVar6);
              for (uVar17 = 0; uVar11 = (ulong)pPVar3->n, uVar17 < uVar11; uVar17 = uVar17 + 1) {
                lVar18 = 0;
                for (uVar13 = 0; uVar13 < uVar11; uVar13 = uVar13 + 1) {
                  poVar6 = operator<<((ostream *)&std::cout,
                                      (RationalNum *)(*(long *)((long)pvVar7 + uVar17 * 8) + lVar18)
                                     );
                  std::operator<<(poVar6," ");
                  uVar11 = (ulong)pPVar3->n;
                  lVar18 = lVar18 + 0x10;
                }
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              }
              poVar6 = std::operator<<((ostream *)&std::cout,"C^(-1):");
              std::endl<char,std::char_traits<char>>(poVar6);
              for (uVar17 = 0; uVar11 = (ulong)pPVar3->n, uVar17 < uVar11; uVar17 = uVar17 + 1) {
                lVar18 = 0;
                for (uVar13 = 0; uVar13 < uVar11; uVar13 = uVar13 + 1) {
                  poVar6 = operator<<((ostream *)&std::cout,
                                      (RationalNum *)((long)&ppRVar10[uVar17]->numerator + lVar18));
                  std::operator<<(poVar6," ");
                  uVar11 = (ulong)pPVar3->n;
                  lVar18 = lVar18 + 0x10;
                }
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              }
              for (uVar17 = 0; ppRVar1 = pPVar3->matrix, uVar17 < uVar11; uVar17 = uVar17 + 1) {
                if (ppRVar1[uVar17] != (RationalNum *)0x0) {
                  operator_delete__(ppRVar1[uVar17]);
                }
                pvVar8 = *(void **)((long)pvVar7 + uVar17 * 8);
                if (pvVar8 != (void *)0x0) {
                  operator_delete__(pvVar8);
                }
                if (matrix[uVar17] != (RationalNum *)0x0) {
                  operator_delete__(matrix[uVar17]);
                }
                if (ppRVar10[uVar17] != (RationalNum *)0x0) {
                  operator_delete__(ppRVar10[uVar17]);
                }
                uVar11 = (ulong)pPVar3->n;
              }
              if (ppRVar1 != (RationalNum **)0x0) {
                operator_delete__(ppRVar1);
              }
              operator_delete__(pvVar7);
              operator_delete__(matrix);
              if (ppRVar10 != (RationalNum **)0x0) {
                operator_delete__(ppRVar10);
              }
            }
            std::
            _Rb_tree<RationalNum,_std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>,_std::_Select1st<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>,_std::less<RationalNum>,_std::allocator<std::pair<const_RationalNum,_std::set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>_>_>_>
            ::~_Rb_tree(&eigenSpaces._M_t);
            std::
            _Rb_tree<RationalNum,_RationalNum,_std::_Identity<RationalNum>,_std::less<RationalNum>,_std::allocator<RationalNum>_>
            ::~_Rb_tree(&eigenValues._M_t);
            return 0;
          }
          pRVar9 = polynomial->coefficients;
          uVar16 = uVar15 - 1;
          if (uVar15 != 0) break;
          RationalNum::RationalNum((RationalNum *)&eigenValues,0,1);
          bVar2 = operator>(pRVar9,(RationalNum *)&eigenValues);
          if (bVar2) {
            poVar6 = std::operator<<((ostream *)&std::cout,"+ ");
            operator<<(poVar6,polynomial->coefficients);
          }
          else {
            pRVar9 = polynomial->coefficients;
            RationalNum::RationalNum((RationalNum *)&eigenValues,0,1);
            bVar2 = operator<(pRVar9,(RationalNum *)&eigenValues);
            if (bVar2) {
              poVar6 = std::operator<<((ostream *)&std::cout,"- ");
              eigenValues._M_t._M_impl._0_16_ = RationalNum::operator-(polynomial->coefficients);
              operator<<(poVar6,(RationalNum *)&eigenValues);
            }
          }
        }
        RationalNum::RationalNum((RationalNum *)&eigenValues,1,1);
        bVar2 = operator==(pRVar9 + uVar15,(RationalNum *)&eigenValues);
        if (!bVar2) break;
        pcVar14 = "x^";
LAB_0010490a:
        poVar6 = std::operator<<((ostream *)&std::cout,pcVar14);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,uVar15);
        std::operator<<(poVar6," ");
      }
      pRVar9 = polynomial->coefficients;
      RationalNum::RationalNum((RationalNum *)&eigenValues,-1,1);
      bVar2 = operator==(pRVar9 + uVar15,(RationalNum *)&eigenValues);
      if (bVar2) {
        pcVar14 = "- x^";
        goto LAB_0010490a;
      }
      pRVar9 = polynomial->coefficients;
      RationalNum::RationalNum((RationalNum *)&eigenValues,0,1);
      bVar2 = operator>(pRVar9 + uVar15,(RationalNum *)&eigenValues);
      if (!bVar2) goto LAB_0010497b;
      poVar6 = std::operator<<((ostream *)&std::cout,"+ ");
      pRVar9 = polynomial->coefficients + uVar15;
      goto LAB_001049e6;
    }
    pcVar14 = "Error while parsing filename";
  }
  poVar6 = std::operator<<((ostream *)&std::cout,pcVar14);
  std::endl<char,std::char_traits<char>>(poVar6);
  return -1;
LAB_0010497b:
  pRVar9 = polynomial->coefficients;
  RationalNum::RationalNum((RationalNum *)&eigenValues,0,1);
  bVar2 = operator<(pRVar9 + uVar15,(RationalNum *)&eigenValues);
  if (bVar2) {
    poVar6 = std::operator<<((ostream *)&std::cout,"- ");
    eigenValues._M_t._M_impl._0_16_ = RationalNum::operator-(polynomial->coefficients + uVar15);
    pRVar9 = (RationalNum *)&eigenValues;
LAB_001049e6:
    poVar6 = operator<<(poVar6,pRVar9);
    poVar6 = std::operator<<(poVar6," ");
    poVar6 = std::operator<<(poVar6,"x^");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,uVar15);
    std::operator<<(poVar6," ");
  }
  goto LAB_001047d3;
}

Assistant:

int main(int argc, char **argv) {
    if (argc < 2) {
        cout << "You must write filename" << endl;
        return -1;
    }

    ParsedInput *input = parseInput(argv[1]);

    if (input == nullptr) {
        cout << "Error while parsing filename" << endl;
        return -1;
    }

    cout << "Matrix:" << endl;
    for (int i = 0; i < input->n; i++) {
        for (int j = 0; j < input->n; j++) {
            cout  << setw(3) << input->matrix[i][j] << " ";
        }
        cout << endl;
    }

    Polynomial *polynomial = getCharacteristicPolynomial(input->matrix, input->n);

    cout << "Characteristics polynomial:" << endl;
    cout << "F(x) = ";
    for (int i = polynomial->degree; i >= 0; i--) {
        if(i > 0) {
            if(polynomial->coefficients[i] == 1ll) {
                cout << "x^" << i << " ";
            }
            else if(polynomial->coefficients[i] == -1ll) {
                cout << "- x^" << i << " ";
            }
            else {
                if(polynomial->coefficients[i] > 0ll) cout << "+ " << polynomial->coefficients[i] << " " << "x^" << i << " ";
                else if(polynomial->coefficients[i] < 0ll) cout << "- " << -polynomial->coefficients[i] << " " << "x^" << i << " ";
            }
        }
        else if(i == 0) {
            if(polynomial->coefficients[i] > 0ll) cout << "+ " << polynomial->coefficients[i];
            else if(polynomial->coefficients[i] < 0ll) cout << "- " << -polynomial->coefficients[i];
        }
    }
    cout << endl;

    cout << "Rational eigenvalues: " << endl;
    set<RationalNum> eigenValues = findRationalSolutions(polynomial);

    int m = 1;
    for(auto eigenValue : eigenValues) {
        cout << "x_" << m++ << " = " << eigenValue << endl;
    }

    map<RationalNum, set<vector<RationalNum>>> eigenSpaces;
    cout << "Eigenspaces: " << endl;
    for(auto eigenValue : eigenValues) {
        set<vector<RationalNum>> basis = getEigenSpaceBasis(input->matrix, input->n, eigenValue);
        eigenSpaces[eigenValue] = basis;
        cout << "L(" << eigenValue << ") = span ( ";
        for(const auto& vector : basis) {
            cout << "(";
            for(int i = 0; i < vector.size(); i++) {
                cout << vector[i];
                if(i < vector.size() - 1) cout << ", ";
            }
            cout << ") ";
        }
        cout << ")" << endl;
    }

    int basisVectorsCount = 0;
    for(const auto& space : eigenSpaces) basisVectorsCount += space.second.size();

    if(basisVectorsCount < input->n) {
        cout << "Not enough eigen vectors to make eigen basis" << endl;
        return 0;
    }

    RationalNum** D = new RationalNum* [input->n];
    RationalNum** C = new RationalNum* [input->n];
    for(int i = 0; i < input->n; i++) {
        D[i] = new RationalNum [input->n];
        C[i] = new RationalNum [input->n];
    }

    m = 0;
    for(const auto& space : eigenSpaces) {
        for(auto basisVector : space.second) {
            D[m][m] = space.first;
            for (int j = 0; j < input->n; j++) C[j][m] = basisVector[j];
            m++;
        }
    }

    RationalNum** C1 = getInverseMatrix(C, input->n);

    cout << "Matrix decomposition: " << endl;
    cout << "A = C D C^(-1)" << endl;
    cout << "C:" << endl;
    for(int i = 0; i < input->n; i++) {
        for(int j = 0; j < input->n; j++) cout << C[i][j] << " ";
        cout << endl;
    }
    cout << "D:" << endl;
    for(int i = 0; i < input->n; i++) {
        for(int j = 0; j < input->n; j++) cout << D[i][j] << " ";
        cout << endl;
    }
    cout << "C^(-1):" << endl;
    for(int i = 0; i < input->n; i++) {
        for(int j = 0; j < input->n; j++) cout << C1[i][j] << " ";
        cout << endl;
    }

    //Освобождение памяти
    for(int i =0 ; i < input->n; i++) {
        delete [] input->matrix[i];
        delete [] D[i];
        delete [] C[i];
        delete [] C1[i];
    }
    delete[] input->matrix;
    delete [] D;
    delete [] C;
    delete [] C1;

    return 0;
}